

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.cpp
# Opt level: O0

void anon_unknown.dwarf_6012::fill_array_impl(my_array<double> a)

{
  reference pvVar1;
  long lVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  ulong local_20;
  size_t k;
  size_t j;
  size_t i;
  
  j = 0;
  while( true ) {
    pvVar1 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&a,0);
    if ((ulong)(long)*pvVar1 <= j) break;
    k = 0;
    while( true ) {
      pvVar1 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&a,1);
      if ((ulong)(long)*pvVar1 <= k) break;
      local_20 = 0;
      while( true ) {
        pvVar1 = std::array<int,_3UL>::operator[]((array<int,_3UL> *)&a,2);
        if ((ulong)(long)*pvVar1 <= local_20) break;
        lVar2 = j * 10000 + k * 100 + local_20;
        auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar4._0_8_ = lVar2;
        auVar4._12_4_ = 0x45300000;
        pdVar3 = custom_array::my_array<double>::operator()
                           ((my_array<double> *)&stack0x00000008,(int)j,(int)k,(int)local_20);
        *pdVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
        local_20 = local_20 + 1;
      }
      k = k + 1;
    }
    j = j + 1;
  }
  return;
}

Assistant:

void fill_array_impl(custom_array::my_array<double> a) {
        for (size_t i = 0; i < a.sizes[0]; ++i)
            for (size_t j = 0; j < a.sizes[1]; ++j)
                for (size_t k = 0; k < a.sizes[2]; ++k) {
                    a(i, j, k) = i * 10000 + j * 100 + k;
                }
    }